

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

void __thiscall session::sendv(session *this,iobuf *bufs,int count)

{
  void *pvVar1;
  int iVar2;
  reference pvVar3;
  iovec *iov_00;
  size_type sVar4;
  char local_68 [4];
  int head_len;
  char head_data [16];
  int local_50;
  int i;
  allocator<iovec> local_39;
  undefined1 local_38 [8];
  vector<iovec,_std::allocator<iovec>_> iov;
  int total;
  int count_local;
  iobuf *bufs_local;
  session *this_local;
  
  iov.super__Vector_base<iovec,_std::allocator<iovec>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0;
  iov.super__Vector_base<iovec,_std::allocator<iovec>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = count;
  std::allocator<iovec>::allocator(&local_39);
  std::vector<iovec,_std::allocator<iovec>_>::vector
            ((vector<iovec,_std::allocator<iovec>_> *)local_38,(long)(count + 1),&local_39);
  std::allocator<iovec>::~allocator(&local_39);
  for (local_50 = 0;
      local_50 <
      iov.super__Vector_base<iovec,_std::allocator<iovec>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_; local_50 = local_50 + 1) {
    pvVar1 = bufs[local_50].data;
    pvVar3 = std::vector<iovec,_std::allocator<iovec>_>::operator[]
                       ((vector<iovec,_std::allocator<iovec>_> *)local_38,(long)(local_50 + 1));
    pvVar3->iov_base = pvVar1;
    iVar2 = bufs[local_50].len;
    pvVar3 = std::vector<iovec,_std::allocator<iovec>_>::operator[]
                       ((vector<iovec,_std::allocator<iovec>_> *)local_38,(long)(local_50 + 1));
    pvVar3->iov_len = (long)iVar2;
    iov.super__Vector_base<iovec,_std::allocator<iovec>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ =
         bufs[local_50].len +
         (int)iov.super__Vector_base<iovec,_std::allocator<iovec>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage;
  }
  iVar2 = encode_head(local_68,0x10,
                      (int)iov.super__Vector_base<iovec,_std::allocator<iovec>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
  pvVar3 = std::vector<iovec,_std::allocator<iovec>_>::operator[]
                     ((vector<iovec,_std::allocator<iovec>_> *)local_38,0);
  pvVar3->iov_base = local_68;
  pvVar3 = std::vector<iovec,_std::allocator<iovec>_>::operator[]
                     ((vector<iovec,_std::allocator<iovec>_> *)local_38,0);
  pvVar3->iov_len = (long)iVar2;
  iov_00 = std::vector<iovec,_std::allocator<iovec>_>::data
                     ((vector<iovec,_std::allocator<iovec>_> *)local_38);
  sVar4 = std::vector<iovec,_std::allocator<iovec>_>::size
                    ((vector<iovec,_std::allocator<iovec>_> *)local_38);
  transmit(this,iov_00,(int)sVar4);
  std::vector<iovec,_std::allocator<iovec>_>::~vector
            ((vector<iovec,_std::allocator<iovec>_> *)local_38);
  return;
}

Assistant:

void session::sendv(iobuf bufs[], int count)
{
    int total = 0;
    std::vector<iovec> iov(count + 1);
    for (int i = 0; i < count; i++)
    {
        iov[i+1].iov_base = (char*)bufs[i].data;
        iov[i+1].iov_len = bufs[i].len;
        total += bufs[i].len;
    }

    char head_data[16];
    int head_len = encode_head(head_data, sizeof(head_data), total);
    iov[0].iov_base = head_data;
    iov[0].iov_len = head_len;
    transmit(iov.data(), iov.size());
}